

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O2

void console_refresh(void)

{
  bool bVar1;
  
  bVar1 = console_is_init();
  if (bVar1) {
    erase();
    refresh();
    refresh_out_win();
    refresh_stt_win();
    refresh_cmd_win();
    return;
  }
  return;
}

Assistant:

void console_refresh() {
    #if defined(SUPPORT_NCURSES)

    if (!console_is_init())
        return;

    erase();
    refresh();
    
    refresh_out_win();
    refresh_stt_win();
    refresh_cmd_win();
    #endif
}